

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int value)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  
  if ((int)param < 200) {
    switch(param) {
    case ZSTD_c_compressionLevel:
      if (value != 0) {
        iVar1 = -0x20000;
        if (-0x20000 < value) {
          iVar1 = value;
        }
        iVar4 = 0x16;
        if (iVar1 < 0x16) {
          iVar4 = iVar1;
        }
        CCtxParams->compressionLevel = iVar4;
      }
      sVar3 = 0;
      if (0 < CCtxParams->compressionLevel) {
        sVar3 = (size_t)(uint)CCtxParams->compressionLevel;
      }
      return sVar3;
    case ZSTD_c_windowLog:
      if (value != 0 && value - 0x20U < 0xffffffea) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->cParams).windowLog = value;
      break;
    case ZSTD_c_hashLog:
      if (value != 0 && value - 0x1fU < 0xffffffe7) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->cParams).hashLog = value;
      break;
    case ZSTD_c_chainLog:
      if (value != 0 && value - 0x1fU < 0xffffffe7) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->cParams).chainLog = value;
      break;
    case ZSTD_c_searchLog:
      if (0x1e < (uint)value) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->cParams).searchLog = value;
      break;
    case ZSTD_c_minMatch:
      if ((4 < value - 3U) && (value != 0)) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->cParams).minMatch = value;
      break;
    case ZSTD_c_targetLength:
      if (0x20000 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->cParams).targetLength = value;
      break;
    case ZSTD_c_strategy:
      if (9 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->cParams).strategy = value;
      break;
    default:
      switch(param) {
      case ZSTD_c_enableLongDistanceMatching:
        (CCtxParams->ldmParams).enableLdm = (uint)(value != 0);
        return (ulong)(value != 0);
      case ZSTD_c_ldmHashLog:
        if (value != 0 && value - 0x1fU < 0xffffffe7) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).hashLog = value;
        break;
      case ZSTD_c_ldmMinMatch:
        if (value != 0 && value - 0x1001U < 0xfffff003) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).minMatchLength = value;
        break;
      case ZSTD_c_ldmBucketSizeLog:
        if (8 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).bucketSizeLog = value;
        break;
      case ZSTD_c_ldmHashRateLog:
        if (0x19 < value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).hashRateLog = value;
        break;
      default:
        if (param != ZSTD_c_experimentalParam2) {
          return 0xffffffffffffffd8;
        }
        if (1 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        CCtxParams->format = value;
      }
    }
  }
  else {
    if ((int)param < 0x192) {
      if ((int)param < 0xca) {
        if (param == ZSTD_c_contentSizeFlag) {
          (CCtxParams->fParams).contentSizeFlag = (uint)(value != 0);
          return (ulong)(value != 0);
        }
        if (param != ZSTD_c_checksumFlag) {
          return 0xffffffffffffffd8;
        }
        (CCtxParams->fParams).checksumFlag = (uint)(value != 0);
        return (ulong)(value != 0);
      }
      if (param == ZSTD_c_dictIDFlag) {
        (CCtxParams->fParams).noDictIDFlag = (uint)(value == 0);
        return (ulong)(value != 0);
      }
      if (param != ZSTD_c_nbWorkers) {
        if (param != ZSTD_c_jobSize) {
          return 0xffffffffffffffd8;
        }
        uVar2 = 0x100000;
        if (0x100000 < value) {
          uVar2 = value;
        }
        sVar3 = (size_t)uVar2;
        if (0x3fffffff < (int)uVar2) {
          sVar3 = 0x40000000;
        }
        if (value == 0) {
          sVar3 = 0;
        }
        CCtxParams->jobSize = sVar3;
        return sVar3;
      }
      uVar2 = 0;
      if (0 < value) {
        uVar2 = value;
      }
      sVar3 = (size_t)uVar2;
      if (199 < (int)uVar2) {
        sVar3 = 200;
      }
      CCtxParams->nbWorkers = (int)sVar3;
      return sVar3;
    }
    switch(param) {
    case ZSTD_c_experimentalParam3:
      CCtxParams->forceWindow = (uint)(value != 0);
      return (ulong)(value != 0);
    case ZSTD_c_experimentalParam4:
      if (3 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->attachDictPref = value;
      break;
    case ZSTD_c_experimentalParam5:
      if (2 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->literalCompressionMode = value;
      break;
    case ZSTD_c_experimentalParam6:
      if (value != 0 && value - 0x20001U < 0xfffe003f) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->targetCBlockSize = (ulong)(uint)value;
      return (ulong)(uint)value;
    case ZSTD_c_experimentalParam7:
      if (value < 0) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->srcSizeHint = value;
      break;
    default:
      if (param == ZSTD_c_overlapLog) {
        uVar2 = 0;
        if (0 < value) {
          uVar2 = value;
        }
        sVar3 = 9;
        if ((int)uVar2 < 9) {
          sVar3 = (size_t)uVar2;
        }
        CCtxParams->overlapLog = (int)sVar3;
        return sVar3;
      }
      if (param != ZSTD_c_experimentalParam1) {
        return 0xffffffffffffffd8;
      }
      uVar2 = 0;
      if (0 < value) {
        uVar2 = value;
      }
      sVar3 = 9;
      if ((int)uVar2 < 9) {
        sVar3 = (size_t)uVar2;
      }
      CCtxParams->rsyncable = (int)sVar3;
      return sVar3;
    }
  }
  return (ulong)(uint)value;
}

Assistant:

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params* CCtxParams,
                                    ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtxParams_setParameter (%i, %i)", (int)param, value);
    switch(param)
    {
    case ZSTD_c_format :
        BOUNDCHECK(ZSTD_c_format, value);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_c_compressionLevel : {
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        if (value) {  /* 0 : does not change current level */
            CCtxParams->compressionLevel = value;
        }
        if (CCtxParams->compressionLevel >= 0) return (size_t)CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_c_windowLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_windowLog, value);
        CCtxParams->cParams.windowLog = (U32)value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_c_hashLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_hashLog, value);
        CCtxParams->cParams.hashLog = (U32)value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_c_chainLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_chainLog, value);
        CCtxParams->cParams.chainLog = (U32)value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_c_searchLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_searchLog, value);
        CCtxParams->cParams.searchLog = (U32)value;
        return (size_t)value;

    case ZSTD_c_minMatch :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_minMatch, value);
        CCtxParams->cParams.minMatch = value;
        return CCtxParams->cParams.minMatch;

    case ZSTD_c_targetLength :
        BOUNDCHECK(ZSTD_c_targetLength, value);
        CCtxParams->cParams.targetLength = value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_c_strategy :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_strategy, value);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_c_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value!=0));
        CCtxParams->fParams.contentSizeFlag = value != 0;
        return CCtxParams->fParams.contentSizeFlag;

    case ZSTD_c_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value != 0;
        return CCtxParams->fParams.checksumFlag;

    case ZSTD_c_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value!=0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_c_forceMaxWindow :
        CCtxParams->forceWindow = (value != 0);
        return CCtxParams->forceWindow;

    case ZSTD_c_forceAttachDict : {
        const ZSTD_dictAttachPref_e pref = (ZSTD_dictAttachPref_e)value;
        BOUNDCHECK(ZSTD_c_forceAttachDict, pref);
        CCtxParams->attachDictPref = pref;
        return CCtxParams->attachDictPref;
    }

    case ZSTD_c_literalCompressionMode : {
        const ZSTD_literalCompressionMode_e lcm = (ZSTD_literalCompressionMode_e)value;
        BOUNDCHECK(ZSTD_c_literalCompressionMode, lcm);
        CCtxParams->literalCompressionMode = lcm;
        return CCtxParams->literalCompressionMode;
    }

    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        CCtxParams->nbWorkers = value;
        return CCtxParams->nbWorkers;
#endif

    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        /* Adjust to the minimum non-default value. */
        if (value != 0 && value < ZSTDMT_JOBSIZE_MIN)
            value = ZSTDMT_JOBSIZE_MIN;
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        assert(value >= 0);
        CCtxParams->jobSize = value;
        return CCtxParams->jobSize;
#endif

    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value));
        CCtxParams->overlapLog = value;
        return CCtxParams->overlapLog;
#endif

    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value));
        CCtxParams->rsyncable = value;
        return CCtxParams->rsyncable;
#endif

    case ZSTD_c_enableLongDistanceMatching :
        CCtxParams->ldmParams.enableLdm = (value!=0);
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_c_ldmHashLog :
        if (value!=0)   /* 0 ==> auto */
            BOUNDCHECK(ZSTD_c_ldmHashLog, value);
        CCtxParams->ldmParams.hashLog = value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_c_ldmMinMatch :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmMinMatch, value);
        CCtxParams->ldmParams.minMatchLength = value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_c_ldmBucketSizeLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmBucketSizeLog, value);
        CCtxParams->ldmParams.bucketSizeLog = value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_c_ldmHashRateLog :
        RETURN_ERROR_IF(value > ZSTD_WINDOWLOG_MAX - ZSTD_HASHLOG_MIN,
                        parameter_outOfBound);
        CCtxParams->ldmParams.hashRateLog = value;
        return CCtxParams->ldmParams.hashRateLog;

    case ZSTD_c_targetCBlockSize :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_targetCBlockSize, value);
        CCtxParams->targetCBlockSize = value;
        return CCtxParams->targetCBlockSize;

    case ZSTD_c_srcSizeHint :
        if (value!=0)    /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_srcSizeHint, value);
        CCtxParams->srcSizeHint = value;
        return CCtxParams->srcSizeHint;

    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
}